

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

lzma_ret lzma_memlimit_set(lzma_stream *strm,uint64_t new_memlimit)

{
  uint64_t local_30;
  uint64_t memusage;
  uint64_t old_memlimit;
  uint64_t new_memlimit_local;
  lzma_stream *strm_local;
  
  if (((strm == (lzma_stream *)0x0) || (strm->internal == (lzma_internal *)0x0)) ||
     ((strm->internal->next).memconfig ==
      (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict12 *)0x0)) {
    strm_local._4_4_ = LZMA_PROG_ERROR;
  }
  else if ((new_memlimit == 0) || (0x7fff < new_memlimit)) {
    old_memlimit = new_memlimit;
    new_memlimit_local = (uint64_t)strm;
    strm_local._4_4_ =
         (*(strm->internal->next).memconfig)
                   ((strm->internal->next).coder,&local_30,&memusage,new_memlimit);
  }
  else {
    strm_local._4_4_ = LZMA_MEMLIMIT_ERROR;
  }
  return strm_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_memlimit_set(lzma_stream *strm, uint64_t new_memlimit)
{
	// Dummy variables to simplify memconfig functions
	uint64_t old_memlimit;
	uint64_t memusage;

	if (strm == NULL || strm->internal == NULL
			|| strm->internal->next.memconfig == NULL)
		return LZMA_PROG_ERROR;

	if (new_memlimit != 0 && new_memlimit < LZMA_MEMUSAGE_BASE)
		return LZMA_MEMLIMIT_ERROR;

	return strm->internal->next.memconfig(strm->internal->next.coder,
			&memusage, &old_memlimit, new_memlimit);
}